

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharGraph.cpp
# Opt level: O2

int __thiscall
Hpipe::CharGraph::clone(CharGraph *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char **args_2;
  pointer pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pVVar6;
  Lexem *pLVar7;
  Lexem *pLVar8;
  undefined4 extraout_var;
  __fn *p_Var9;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *val;
  Arg *arg;
  pointer src;
  void *__arg_00;
  string *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  char *in_R9;
  long lVar11;
  allocator local_20b;
  allocator local_20a;
  allocator local_209;
  allocator local_208;
  allocator local_207;
  allocator local_206;
  allocator local_205;
  allocator local_204;
  allocator local_203;
  allocator local_202;
  allocator local_201;
  Lexem *local_200;
  __fn *local_1f8;
  long *local_1f0;
  Pool<Hpipe::Lexem,32> *local_1e8;
  string local_1e0;
  Vec<Hpipe::CharGraph::Arg> *__range3;
  Vec<Hpipe::CharGraph::Arg> cargs;
  Lexem *ch;
  string local_168;
  string local_148;
  string local_128;
  vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pLVar7 = (Lexem *)*___flags;
  local_1e8 = (Pool<Hpipe::Lexem,32> *)&this->le_pool;
  pVVar6 = &this->calls;
  local_1f8 = __fn;
  local_1f0 = (long *)__child_stack;
  __range3 = (Vec<Hpipe::CharGraph::Arg> *)__arg;
  do {
    psVar10 = (string *)&cargs;
    if (pLVar7 == (Lexem *)0x0) {
      return (int)pVVar6;
    }
    if (in_R9 != (char *)0x0) {
      std::__cxx11::string::string((string *)psVar10,in_R9,(allocator *)&local_1e0);
      bVar2 = Lexem::eq(pLVar7,OPERATOR,psVar10);
      iVar5 = std::__cxx11::string::~string((string *)psVar10);
      if (bVar2) {
        return iVar5;
      }
      pLVar7 = (Lexem *)*___flags;
    }
    if (pLVar7->type == VARIABLE) {
      bVar2 = std::operator==(&pLVar7->str,"eof");
      pLVar7 = (Lexem *)*___flags;
      if (bVar2) goto LAB_001467f3;
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      psVar10 = &local_128;
      clone(this,local_1f8,local_1f0,(int)pLVar7 + 8,pLVar7,psVar10,__arg);
LAB_00146bcd:
      std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::~vector
                ((vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> *)psVar10);
    }
    else {
LAB_001467f3:
      std::__cxx11::string::string((string *)psVar10,"[",(allocator *)&local_1e0);
      bVar2 = Lexem::eq(pLVar7,OPERATOR,psVar10);
      std::__cxx11::string::~string((string *)psVar10);
      if (bVar2) {
        pLVar7 = *(Lexem **)(*___flags + 0x38);
        std::__cxx11::string::string((string *)psVar10,"skip",&local_201);
        bVar3 = Lexem::eq(pLVar7,psVar10);
        if (!bVar3) {
          std::__cxx11::string::string((string *)&local_1e0,"add_str",&local_202);
          bVar3 = Lexem::eq(pLVar7,&local_1e0);
          if (!bVar3) {
            std::__cxx11::string::string((string *)&local_168,"clr_str",&local_203);
            bVar3 = Lexem::eq(pLVar7,&local_168);
            if (!bVar3) {
              std::__cxx11::string::string((string *)&ch,"beg_str",&local_204);
              bVar3 = Lexem::eq(pLVar7,(string *)&ch);
              bVar4 = true;
              if (!bVar3) {
                std::__cxx11::string::string((string *)&local_148,"beg_str_next",&local_205);
                bVar3 = Lexem::eq(pLVar7,&local_148);
                bVar4 = true;
                if (!bVar3) {
                  std::__cxx11::string::string((string *)&local_70,"end_str",&local_206);
                  bVar3 = Lexem::eq(pLVar7,&local_70);
                  bVar4 = true;
                  if (!bVar3) {
                    std::__cxx11::string::string((string *)&local_90,"end_str_next",&local_207);
                    bVar3 = Lexem::eq(pLVar7,&local_90);
                    bVar4 = true;
                    if (!bVar3) {
                      std::__cxx11::string::string((string *)&local_b0,"add_include",&local_208);
                      bVar3 = Lexem::eq(pLVar7,&local_b0);
                      bVar4 = true;
                      if (!bVar3) {
                        std::__cxx11::string::string((string *)&local_d0,"add_prel",&local_209);
                        bVar3 = Lexem::eq(pLVar7,&local_d0);
                        bVar4 = true;
                        if (!bVar3) {
                          std::__cxx11::string::string
                                    ((string *)&local_f0,"add_preliminary",&local_20a);
                          bVar3 = Lexem::eq(pLVar7,&local_f0);
                          bVar4 = true;
                          if (!bVar3) {
                            std::__cxx11::string::string
                                      ((string *)&local_50,"add_variable",&local_20b);
                            bVar4 = Lexem::eq(pLVar7,&local_50);
                            std::__cxx11::string::~string((string *)&local_50);
                          }
                          std::__cxx11::string::~string((string *)&local_f0);
                        }
                        std::__cxx11::string::~string((string *)&local_d0);
                      }
                      std::__cxx11::string::~string((string *)&local_b0);
                    }
                    std::__cxx11::string::~string((string *)&local_90);
                  }
                  std::__cxx11::string::~string((string *)&local_70);
                }
                std::__cxx11::string::~string((string *)&local_148);
              }
              std::__cxx11::string::~string((string *)&ch);
              std::__cxx11::string::~string((string *)&local_168);
              std::__cxx11::string::~string((string *)&local_1e0);
              std::__cxx11::string::~string((string *)psVar10);
              if (bVar4 == false) {
                get_cargs((Vec<Hpipe::CharGraph::Arg> *)psVar10,this,*(Lexem **)(*___flags + 0x40),
                          (Vec<Hpipe::CharGraph::Arg> *)__arg,true);
                __arg_00 = *(void **)(*___flags + 0x38);
                if (*(int *)((long)__arg_00 + 0x28) != 1) {
                  Lexer::err(this->lexer,*(Lexem **)(*___flags + 0x40),
                             "xxx in xxx[] should be a variable");
                  this->ok = false;
                  __arg_00 = *(void **)(*___flags + 0x38);
                }
                std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::vector
                          (&local_108,
                           (vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> *)
                           psVar10);
                clone(this,local_1f8,local_1f0,(int)__arg_00 + 8,__arg_00,&local_108,__arg);
                std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::~vector
                          (&local_108);
                goto LAB_00146bcd;
              }
              goto LAB_001468cf;
            }
            std::__cxx11::string::~string((string *)&local_168);
          }
          std::__cxx11::string::~string((string *)&local_1e0);
        }
        std::__cxx11::string::~string((string *)psVar10);
      }
LAB_001468cf:
      args_2 = (char **)*___flags;
      args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(args_2 + 1);
      pLVar7 = Pool<Hpipe::Lexem,32>::
               New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string_const&>
                         (local_1e8,(anon_enum_32 *)(args_2 + 5),(Source **)(args_2 + 6),args_2,
                          args_3);
      p_Var9 = (__fn *)(*local_1f0 + 0x50);
      if (*(long *)local_1f8 == 0) {
        p_Var9 = local_1f8;
      }
      *(Lexem **)p_Var9 = pLVar7;
      *local_1f0 = (long)pLVar7;
      local_200 = pLVar7;
      if ((*(int *)(*___flags + 0x28) == 8) || (*(int *)(*___flags + 0x28) == 4)) {
        pAVar1 = (__range3->
                 super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                 super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        psVar10 = &pLVar7->str;
        for (src = (__range3->
                   super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                   super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                   ._M_impl.super__Vector_impl_data._M_start; src != pAVar1; src = src + 1) {
          pLVar8 = src->val;
          std::__cxx11::string::string((string *)&cargs,"(",(allocator *)&local_1e0);
          bVar3 = Lexem::eq(pLVar8,OPERATOR,(string *)&cargs);
          std::__cxx11::string::~string((string *)&cargs);
          pLVar7 = local_200;
          if (bVar3) {
            pLVar8 = pLVar8->children[0];
          }
          if (pLVar8->next != (Lexem *)0x0) {
            Lexer::err(this->lexer,pLVar8->next,
                       "When a variable is used in a code, it is expected to be a single lexem");
            this->ok = false;
          }
          repl_all(psVar10,&src->name,&pLVar8->str);
        }
      }
      __arg = __range3;
      for (lVar11 = 7; lVar11 != 9; lVar11 = lVar11 + 1) {
        pLVar8 = (Lexem *)*___flags;
        ch = pLVar8->children[lVar11 + -7];
        if (ch != (Lexem *)0x0) {
          if (lVar11 == 7) {
            std::__cxx11::string::string((string *)&cargs,"->",(allocator *)&local_168);
            bVar3 = Lexem::eq(pLVar8,OPERATOR,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cargs);
            if (bVar3) {
              std::__cxx11::string::~string((string *)&cargs);
              val = extraout_RDX;
            }
            else {
              pLVar7 = (Lexem *)*___flags;
              std::__cxx11::string::string((string *)&local_1e0,"<-",(allocator *)&local_148);
              bVar3 = Lexem::eq(pLVar7,OPERATOR,&local_1e0);
              std::__cxx11::string::~string((string *)&local_1e0);
              std::__cxx11::string::~string((string *)&cargs);
              pLVar7 = local_200;
              val = extraout_RDX_00;
              if (!bVar3) {
                if (!bVar2) goto LAB_00146b66;
                args_3 = &ch->str;
                pLVar8 = Pool<Hpipe::Lexem,32>::
                         New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string_const&>
                                   (local_1e8,&ch->type,&ch->source,&ch->beg,args_3);
                pLVar7->children[0] = pLVar8;
                goto LAB_00146b7c;
              }
            }
            pLVar7 = ch;
            local_148._M_dataplus._M_p = (pointer)&this->calls;
            to_string<Hpipe::Values<Hpipe::Vec<std::__cxx11::string>>>
                      (&local_168,(Hpipe *)&local_148,val);
            std::operator+(&local_1e0,&local_168," ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cargs,&local_1e0,&ch->str);
            args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cargs;
            pLVar8 = Pool<Hpipe::Lexem,32>::
                     New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string>
                               (local_1e8,&pLVar7->type,&pLVar7->source,&pLVar7->beg,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cargs);
            pLVar7 = local_200;
            local_200->children[0] = pLVar8;
            std::__cxx11::string::~string((string *)&cargs);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::string::~string((string *)&local_168);
          }
          else {
LAB_00146b66:
            iVar5 = clone(this,(__fn *)&ch,__arg,0,args_3);
            pLVar7->children[lVar11 + -7] = (Lexem *)CONCAT44(extraout_var,iVar5);
          }
LAB_00146b7c:
          pLVar7->children[lVar11 + -7]->parent = pLVar7;
        }
      }
    }
    pVVar6 = (Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)*___flags;
    pLVar7 = *(Lexem **)((long)(pVVar6 + 3) + 8);
    *___flags = (long)pLVar7;
  } while( true );
}

Assistant:

void CharGraph::clone( Lexem *&beg, Lexem *&end, const Lexem *&l, const Vec<Arg> &args, const char *stop ) {
    for( ; l; l = l->next ) {
        if ( stop and l->eq( Lexem::OPERATOR, stop ) )
            break;

        // variables
        auto keyword = []( const std::string &str ) {
            return str == "eof";
        };
        if ( l->type == Lexem::VARIABLE and not keyword( l->str ) ) {
            clone( beg, end, l->str, l, {}, args );
            continue;
        }

        // function call ( func[ args ] )
        auto is_inline = []( const Lexem *l ) {
            return l->eq( "skip" ) or l->eq( "add_str" ) or l->eq( "clr_str" ) or l->eq( "beg_str" )  or l->eq( "beg_str_next" ) or l->eq( "end_str" )  or l->eq( "end_str_next" ) or
                   l->eq( "add_include" ) or l->eq( "add_prel" ) or l->eq( "add_preliminary" ) or l->eq( "add_variable" );
        };

        bool do_not_clone_ch_0 = false;
        if ( l->eq( Lexem::OPERATOR, "[" ) ) {
            if ( is_inline( l->children[ 0 ] ) ) {
                do_not_clone_ch_0 = true;
            } else {
                // get arguments
                Vec<Arg> cargs = get_cargs( l->children[ 1 ], args, true );

                // find machine
                if ( l->children[ 0 ]->type != Lexem::VARIABLE ) {
                    lexer.err( l->children[ 1 ], "xxx in xxx[] should be a variable" );
                    ok = false;
                }
                clone( beg, end, l->children[ 0 ]->str, l->children[ 0 ], cargs, args );
                continue;
            }
        }

        // default case
        Lexem *res = le_pool.New( l->type, l->source, l->beg, l->str );
        if ( beg ) end->next = res;
        else beg = res;
        end = res;

        // modifications
        switch ( l->type ) {
        case Lexem::STRING:
        case Lexem::CODE:
            for( const Arg &arg : args ) {
                const Lexem *val = arg.val;
                if ( val->eq( Lexem::OPERATOR, "(" ) )
                    val = val->children[ 0 ];
                if ( val->next ) {
                    lexer.err( val->next, "When a variable is used in a code, it is expected to be a single lexem" );
                    ok = false;
                }
                repl_all( res->str, arg.name, val->str );
            }
            break;
        default:
            break;
        }

        for( unsigned i = 0; i < 2; ++i ) {
            if ( const Lexem *ch = l->children[ i ] ) {
                if ( i == 0 and ( l->eq( Lexem::OPERATOR, "->" ) or l->eq( Lexem::OPERATOR, "<-" ) ) )
                    res->children[ i ] = le_pool.New( ch->type, ch->source, ch->beg, to_string( values( calls ) ) + " " + ch->str );
                else if ( i == 0 and do_not_clone_ch_0 )
                    res->children[ i ] = le_pool.New( ch->type, ch->source, ch->beg, ch->str );
                else
                    res->children[ i ] = clone( ch, args );
                res->children[ i ]->parent = res;
            }
        }
    }
}